

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O1

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,ProgramNode *node)

{
  pointer pcVar1;
  undefined8 *puVar2;
  _List_node_base *p_Var3;
  optional<std::reference_wrapper<Symbol>_> oVar4;
  FunctionAnalyser analyser;
  undefined1 local_78 [24];
  undefined8 local_60 [3];
  string local_48;
  
  for (p_Var3 = (node->variables_).
                super__List_base<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&node->variables_; p_Var3 = p_Var3->_M_next) {
    (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))(p_Var3[1]._M_next,this);
  }
  for (p_Var3 = (node->functions_).
                super__List_base<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&node->functions_; p_Var3 = p_Var3->_M_next) {
    (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))(p_Var3[1]._M_next,this);
  }
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"main","");
  oVar4 = SymbolTable::lookup(&this->symbols_,(string *)local_78,0);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_78._20_4_,local_78._16_4_) + 1);
  }
  if (((undefined1  [16])
       oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_78._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Main function was not found!","");
    reportError((string *)local_78,&node->super_Node);
  }
  FunctionAnalyser::FunctionAnalyser((FunctionAnalyser *)local_78);
  (**(code **)(*(long *)oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,local_78);
  if (local_78[8] == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Symbol main does not name a function!","");
    reportError(&local_48,&node->super_Node);
  }
  if ((CONCAT44(local_78._16_4_,local_78._12_4_) & 0x1ffffffff) != 0x100000000) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Main should return F32!","");
    reportError(&local_48,&node->super_Node);
  }
  local_78._0_8_ = &PTR__FunctionAnalyser_00156df0;
  while ((undefined8 *)local_60[0] != local_60) {
    puVar2 = *(undefined8 **)local_60[0];
    operator_delete((void *)local_60[0],0x18);
    local_60[0] = puVar2;
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const ProgramNode& node) 
{
  for(const auto& var : node.getVariables())
    var->accept(*this);
  
  for(const auto& func : node.getFunctions())
    func->accept(*this);

  const auto symbol = symbols_.lookup("main");
  if(!symbol)
    reportError("Main function was not found!", node);
  
  FunctionAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Symbol main does not name a function!", node);
  else if(analyser.getReturnType() != TypeName::F32)
    reportError("Main should return F32!", node);
}